

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O1

bool __thiscall
cmMacroFunctionBlocker::IsFunctionBlocked
          (cmMacroFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *param_3)

{
  int iVar1;
  cmCommand *command;
  cmState *this_00;
  string local_58;
  _Map_pointer local_38;
  
  iVar1 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"macro");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar1 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endmacro");
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"MACROS","");
        cmMakefile::AppendProperty
                  (mf,&local_58,
                   (((this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        command = (cmCommand *)operator_new(0xa0);
        command->Makefile = (cmMakefile *)0x0;
        (command->Error)._M_dataplus._M_p = (pointer)&(command->Error).field_2;
        (command->Error)._M_string_length = 0;
        (command->Error).field_2._M_local_buf[0] = '\0';
        command->_vptr_cmCommand = (_func_int **)&PTR__cmMacroHelperCommand_0068ec60;
        command[1]._vptr_cmCommand = (_func_int **)0x0;
        command[1].Makefile = (cmMakefile *)0x0;
        command[1].Error._M_dataplus._M_p = (pointer)0x0;
        command[1].Error._M_string_length = 0;
        command[1].Error.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&command[1].Error.field_2 + 8) = 0;
        command[2]._vptr_cmCommand = (_func_int **)0x0;
        command[2].Makefile = (cmMakefile *)0x0;
        command[2].Error._M_dataplus._M_p = (pointer)0x0;
        command[2].Error._M_string_length = 0;
        command[2].Error.field_2._M_allocated_capacity = (size_type)(command + 3);
        *(undefined8 *)((long)&command[2].Error.field_2 + 8) = 0;
        *(undefined1 *)&command[3]._vptr_cmCommand = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(command + 1),&this->Args);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
                  ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                   &command[1].Error._M_string_length,&this->Functions);
        std::__cxx11::string::_M_assign((string *)command[2].Error.field_2._M_local_buf);
        cmMakefile::RecordPolicies(mf,(PolicyMap *)(command + 2));
        this_00 = cmMakefile::GetState(mf);
        cmState::AddScriptedCommand
                  (this_00,(this->Args).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,command);
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffffc8,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        if (local_38 == (_Map_pointer)0x0) {
          return true;
        }
        (**(code **)((long)&(*local_38)->field_2 + 8))();
        return true;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmMacroFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                               cmMakefile& mf,
                                               cmExecutionStatus&)
{
  // record commands until we hit the ENDMACRO
  // at the ENDMACRO call we shift gears and start looking for invocations
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "macro")) {
    this->Depth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endmacro")) {
    // if this is the endmacro for this macro then execute
    if (!this->Depth) {
      mf.AppendProperty("MACROS", this->Args[0].c_str());
      // create a new command and add it to cmake
      cmMacroHelperCommand* f = new cmMacroHelperCommand();
      f->Args = this->Args;
      f->Functions = this->Functions;
      f->FilePath = this->GetStartingContext().FilePath;
      mf.RecordPolicies(f->Policies);
      mf.GetState()->AddScriptedCommand(this->Args[0], f);
      // remove the function blocker now that the macro is defined
      mf.RemoveFunctionBlocker(this, lff);
      return true;
    }
    // decrement for each nested macro that ends
    this->Depth--;
  }

  // if it wasn't an endmacro and we are not executing then we must be
  // recording
  this->Functions.push_back(lff);
  return true;
}